

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::AddEnumValueInternal
          (Reflection *this,Message *message,FieldDescriptor *field,int value)

{
  RepeatedField<int> *this_00;
  int number;
  uint uVar1;
  uint32 uVar2;
  ulong uVar3;
  int *piVar4;
  _func_void_FieldDescriptor_ptr *local_40;
  FieldDescriptor *local_38;
  
  if (field[0x43] == (FieldDescriptor)0x1) {
    uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    number = *(int *)(field + 0x44);
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_40 = FieldDescriptor::TypeOnceInit;
      local_38 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),&local_40,&local_38);
    }
    internal::ExtensionSet::AddEnum
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),number,
               (FieldType)field[0x38],*(bool *)(*(long *)(field + 0x78) + 0x4c),value,field);
  }
  else {
    uVar2 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar3 = (ulong)uVar2;
    this_00 = (RepeatedField<int> *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar3);
    uVar1 = *(uint *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar3);
    if (uVar1 == *(uint *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar3 + 4)) {
      RepeatedField<int>::Reserve(this_00,uVar1 + 1);
    }
    piVar4 = RepeatedField<int>::elements(this_00);
    piVar4[uVar1] = value;
    this_00->current_size_ = uVar1 + 1;
  }
  return;
}

Assistant:

void Reflection::AddEnumValueInternal(Message* message,
                                      const FieldDescriptor* field,
                                      int value) const {
  if (field->is_extension()) {
    MutableExtensionSet(message)->AddEnum(field->number(), field->type(),
                                          field->options().packed(), value,
                                          field);
  } else {
    AddField<int>(message, field, value);
  }
}